

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,NetType *netType)

{
  size_t sVar1;
  HierarchicalInstanceSyntax *instanceSyntax;
  ASTContext *context_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  string_view sVar2;
  const_iterator __begin3;
  ASTContext context;
  
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  params = createUninstantiatedParams
                     ((ast *)syntax,(HierarchyInstantiationSyntax *)&context,context_00);
  if (specificInstance == (HierarchicalInstanceSyntax *)0x0) {
    __begin3.index = 0;
    sVar1 = (syntax->instances).elements._M_extent._M_extent_value;
    __begin3.list = &syntax->instances;
    for (; (__begin3.list != &syntax->instances || (__begin3.index != sVar1 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      instanceSyntax =
           slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
           iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference(&__begin3);
      sVar2 = parsing::Token::valueText(&syntax->type);
      createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
                (compilation,syntax,instanceSyntax,sVar2,&context,params,results,implicitNets,
                 implicitNetNames,netType);
    }
  }
  else {
    sVar2 = parsing::Token::valueText(&syntax->type);
    createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
              (compilation,syntax,specificInstance,sVar2,&context,params,results,implicitNets,
               implicitNetNames,netType);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(
    Compilation& compilation, const syntax::HierarchyInstantiationSyntax& syntax,
    const syntax::HierarchicalInstanceSyntax* specificInstance, const ASTContext& parentContext,
    SmallVectorBase<const Symbol*>& results, SmallVectorBase<const Symbol*>& implicitNets,
    SmallSet<std::string_view, 8>& implicitNetNames, const NetType& netType) {

    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, params, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, params, results, implicitNets, implicitNetNames,
                                    netType);
        }
    }
}